

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::peer_connection::second_tick(peer_connection *this,int tick_interval_ms)

{
  int *piVar1;
  _Atomic_word *p_Var2;
  undefined1 *puVar3;
  list<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
  *plVar4;
  byte bVar5;
  int iVar6;
  int32_t iVar7;
  session_settings *psVar8;
  session_interface *psVar9;
  torrent_peer *ptVar10;
  undefined1 auVar11 [16];
  _WordT _Var12;
  bool bVar13;
  char cVar14;
  int iVar15;
  int iVar16;
  piece_index_t new_piece;
  int iVar17;
  alert_manager *paVar18;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar19;
  long lVar20;
  _List_node_base *p_Var21;
  peer_connection *ppVar22;
  const_iterator __end2;
  uint uVar23;
  int tick_interval_ms_00;
  long lVar24;
  byte bVar25;
  ulong uVar26;
  bool bVar27;
  shared_ptr<libtorrent::aux::peer_connection> me;
  torrent *local_90;
  undefined1 local_88 [8];
  error_category *local_80;
  duration local_78;
  long local_70;
  int local_64;
  peer_connection *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  undefined1 local_50 [24];
  element_type *local_38;
  
  local_80 = (error_category *)local_88;
  local_64 = tick_interval_ms;
  local_78.__r = (rep)time_now();
  ::std::__shared_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libtorrent::aux::peer_connection,void>
            ((__shared_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2> *)
             (local_50 + 0x10),
             (__weak_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<libtorrent::aux::peer_connection>);
  local_58 = (this->super_peer_connection_hot_members).m_torrent.
             super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar15 = local_58->_M_use_count;
    do {
      if (iVar15 == 0) {
        local_58 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar16 = local_58->_M_use_count;
      bVar27 = iVar15 == iVar16;
      if (bVar27) {
        local_58->_M_use_count = iVar15 + 1;
        iVar16 = iVar15;
      }
      iVar15 = iVar16;
      UNLOCK();
    } while (!bVar27);
  }
  if (local_58 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar27 = true;
  }
  else {
    bVar27 = local_58->_M_use_count == 0;
  }
  if (bVar27) {
    local_90 = (torrent *)0x0;
  }
  else {
    local_90 = (this->super_peer_connection_hot_members).m_torrent.
               super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  psVar8 = (this->super_peer_connection_hot_members).m_settings;
  local_80._0_1_ = 0;
  local_88 = (undefined1  [8])&psVar8->m_mutex;
  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_88);
  local_80._0_1_ = true;
  _Var12 = (psVar8->m_store).m_bools.super__Base_bitset<2UL>._M_w[0];
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_88);
  bVar25 = 0;
  if ((((uint)_Var12 >> 0x10 & 1) != 0) && (local_90 != (torrent *)0x0)) {
    psVar9 = (this->super_peer_connection_hot_members).m_ses;
    iVar15 = (*(psVar9->super_session_logger)._vptr_session_logger[0x35])
                       (psVar9,&(this->super_peer_connection_hot_members).field_0x2c,
                        (ulong)*(uint *)&(this->m_statistics).m_stat.
                                         super_array<libtorrent::aux::stat_channel,_6UL>.field_0x58,
                        (ulong)*(uint *)&(this->m_statistics).m_stat.
                                         super_array<libtorrent::aux::stat_channel,_6UL>.field_0x48)
    ;
    psVar9 = (this->super_peer_connection_hot_members).m_ses;
    iVar16 = (*(psVar9->super_session_logger)._vptr_session_logger[0x35])
                       (psVar9,&local_90->super_peer_class_set,
                        (ulong)*(uint *)&(this->m_statistics).m_stat.
                                         super_array<libtorrent::aux::stat_channel,_6UL>.field_0x58,
                        (ulong)*(uint *)&(this->m_statistics).m_stat.
                                         super_array<libtorrent::aux::stat_channel,_6UL>.field_0x48)
    ;
    bVar25 = (byte)iVar16 | (byte)iVar15;
  }
  local_60 = this;
  if ((bVar25 != 0) &&
     (paVar18 = torrent::alerts(local_90), ((paVar18->m_alert_mask)._M_i.m_val >> 9 & 1) != 0)) {
    uVar23 = 0;
    do {
      if ((bVar25 >> (uVar23 & 0x1f) & 1) != 0) {
        paVar18 = torrent::alerts(local_90);
        torrent::get_handle((torrent *)local_50);
        local_88._0_4_ = uVar23 == 1 | 2;
        alert_manager::
        emplace_alert<libtorrent::performance_alert,libtorrent::torrent_handle,libtorrent::performance_alert::performance_warning_t>
                  (paVar18,(torrent_handle *)local_50,(performance_warning_t *)local_88);
        if ((piece_picker *)local_50._8_8_ != (piece_picker *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            piVar1 = (int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_50._8_8_)->
                                    super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                    ).
                                    super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + 4);
            iVar15 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
          }
          else {
            iVar15 = *(int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_50._8_8_)->
                                     super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                     ).
                                     super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                     ._M_impl.super__Vector_impl_data._M_finish + 4);
            *(int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_50._8_8_)->
                            super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                            ).
                            super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                            ._M_impl.super__Vector_impl_data._M_finish + 4) = iVar15 + -1;
          }
          if (iVar15 == 1) {
            (*(code *)(((vector<piece_pos,_piece_index_t> *)local_50._8_8_)->
                      super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                      ).
                      super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                      ._M_impl.super__Vector_impl_data._M_start[3])();
          }
        }
      }
      uVar23 = uVar23 + 1;
    } while (uVar23 == 1);
  }
  ppVar22 = local_60;
  if ((local_90 == (torrent *)0x0) ||
     (bVar25 = (local_60->super_peer_connection_hot_members).field_0x28, (bVar25 & 1) != 0)) {
    if (((local_60->super_peer_connection_hot_members).field_0x28 & 2) != 0) {
      counters::inc_stats_counter(local_60->m_counters,0xe5,-1);
      if ((local_90 != (torrent *)0x0) &&
         (ptVar10 = ppVar22->m_peer_info,
         local_90->m_num_connecting = local_90->m_num_connecting - 1,
         (ptVar10->field_0x1b & 0x80) != 0)) {
        local_90->m_num_connecting_seeds = local_90->m_num_connecting_seeds - 1;
      }
      puVar3 = &(ppVar22->super_peer_connection_hot_members).field_0x28;
      *puVar3 = *puVar3 & 0xfd;
    }
    _local_88 = errors::make_error_code(torrent_aborted);
    (*(ppVar22->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(ppVar22,local_88,1,0);
  }
  else {
    if (((((~bVar25 & 0x14) == 0) &&
         ((local_60->m_download_queue).
          super_vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
          .
          super__Vector_base<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (local_60->m_download_queue).
          super_vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
          .
          super__Vector_base<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
          ._M_impl.super__Vector_impl_data._M_finish)) &&
        ((local_60->m_request_queue).
         super__Vector_base<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         (local_60->m_request_queue).
         super__Vector_base<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
         ._M_impl.super__Vector_impl_data._M_finish)) &&
       (lVar24 = (local_60->m_connect).__d.__r,
       (long)(local_60->m_last_request).m_time_diff.__r * 1000000 + lVar24 <=
       local_78.__r + -5000000000)) {
      auVar11 = SEXT816(local_78.__r - lVar24) * SEXT816(0x431bde82d7b634db);
      (local_60->m_last_request).m_time_diff.__r =
           (int)(auVar11._8_8_ >> 0x12) - (auVar11._12_4_ >> 0x1f);
      bVar27 = request_a_block(local_90,local_60);
      if (bVar27) {
        counters::inc_stats_counter(ppVar22->m_counters,0x1f,1);
      }
      if (((ppVar22->super_peer_connection_hot_members).field_0x28 & 1) != 0) goto LAB_0024e589;
      send_block_requests(ppVar22);
    }
    if ((((local_90->field_0x5cc & 8) != 0) &&
        (((local_90->super_torrent_hot_members).field_0x4b & 2) != 0)) &&
       (((ppVar22->field_0x887 & 2) == 0 &&
        ((long)(ppVar22->m_became_uninterested).m_time_diff.__r * 1000000 +
         (ppVar22->m_connect).__d.__r + 10000000000 < local_78.__r)))) {
      new_piece = torrent::get_piece_to_super_seed
                            (local_90,&(ppVar22->super_peer_connection_hot_members).m_have_piece);
      superseed_piece(ppVar22,(piece_index_t)0xffffffff,new_piece);
    }
    (*(ppVar22->super_bandwidth_socket)._vptr_bandwidth_socket[0x2f])(ppVar22);
    iVar15 = (*(ppVar22->super_bandwidth_socket)._vptr_bandwidth_socket[1])(ppVar22);
    if ((char)iVar15 == '\0') {
      plVar4 = &ppVar22->m_extensions;
      p_Var21 = (_List_node_base *)plVar4;
      while (p_Var21 = (((_List_base<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
                          *)&p_Var21->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
            p_Var21 != (_List_node_base *)plVar4) {
        (**(code **)(*(long *)p_Var21[1]._M_next + 0x150))();
      }
      iVar15 = (*(ppVar22->super_bandwidth_socket)._vptr_bandwidth_socket[1])(ppVar22);
      if ((char)iVar15 == '\0') {
        lVar24 = (local_78.__r - (ppVar22->m_connect).__d.__r) +
                 (long)(ppVar22->m_last_receive).m_time_diff.__r * -1000000;
        if (((ppVar22->super_peer_connection_hot_members).field_0x28 & 2) != 0) {
          psVar8 = (ppVar22->super_peer_connection_hot_members).m_settings;
          local_80._0_1_ = 0;
          local_88 = (undefined1  [8])&psVar8->m_mutex;
          ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_88);
          local_80._0_1_ = true;
          iVar15 = (psVar8->m_store).m_ints._M_elems[0x11];
          ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_88);
          if (ppVar22->m_peer_info != (torrent_peer *)0x0) {
            iVar15 = (*(uint *)&ppVar22->m_peer_info->field_0x1b & 0x1f) * 3 + iVar15;
          }
          bVar27 = is_ssl(&ppVar22->m_socket);
          bVar13 = is_i2p(&ppVar22->m_socket);
          iVar16 = iVar15 + 10;
          if (!bVar27) {
            iVar16 = iVar15;
          }
          iVar15 = iVar16 + 0x14;
          if (!bVar13) {
            iVar15 = iVar16;
          }
          if ((long)iVar15 * 1000000000 < lVar24) {
            _local_88 = errors::make_error_code(timed_out);
            p_Var21 = (_List_node_base *)plVar4;
            do {
              p_Var21 = (((_List_base<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
                           *)&p_Var21->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
              if (p_Var21 == (_List_node_base *)plVar4) goto LAB_0024eefc;
              cVar14 = (**(code **)(*(long *)p_Var21[1]._M_next + 0x128))
                                 (p_Var21[1]._M_next,local_88);
            } while (cVar14 != '\0');
            if (p_Var21 == (_List_node_base *)plVar4) {
LAB_0024eefc:
              peer_log(ppVar22,info,"CONNECT_FAILED","waited %d seconds",
                       (ulong)(uint)((int)(SUB168(SEXT816(lVar24) * SEXT816(0x112e0be826d694b3),8)
                                          >> 0x1a) -
                                    (SUB164(SEXT816(lVar24) * SEXT816(0x112e0be826d694b3),0xc) >>
                                    0x1f)));
              _local_88 = errors::make_error_code(timed_out);
              connect_failed(ppVar22,(error_code *)local_88);
              goto LAB_0024e589;
            }
          }
        }
        bVar25 = (ppVar22->m_channel_state).
                 super_array<libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::bandwidth_state_flags_tag,_void>,_2UL>
                 ._M_elems[1].m_val;
        local_70 = lVar24;
        if ((bVar25 & 4) != 0) {
          iVar15 = (*(ppVar22->super_bandwidth_socket)._vptr_bandwidth_socket[0x33])(ppVar22);
          if ((((long)iVar15 * 1000000000 < lVar24) &&
              (((ppVar22->super_peer_connection_hot_members).field_0x28 & 2) == 0)) &&
             (ppVar22->m_reading_bytes == 0)) {
            _local_88 = errors::make_error_code(timed_out_inactivity);
            p_Var21 = (_List_node_base *)plVar4;
            do {
              p_Var21 = (((_List_base<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
                           *)&p_Var21->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
              if (p_Var21 == (_List_node_base *)plVar4) goto LAB_0024e8c2;
              cVar14 = (**(code **)(*(long *)p_Var21[1]._M_next + 0x128))
                                 (p_Var21[1]._M_next,local_88);
            } while (cVar14 != '\0');
            if (p_Var21 == (_List_node_base *)plVar4) {
LAB_0024e8c2:
              peer_log(ppVar22,info,"LAST_ACTIVITY","%d seconds ago",
                       (ulong)(uint)((int)(SUB168(SEXT816(local_70) * SEXT816(0x112e0be826d694b3),8)
                                          >> 0x1a) -
                                    (SUB164(SEXT816(local_70) * SEXT816(0x112e0be826d694b3),0xc) >>
                                    0x1f)));
              _local_88 = errors::make_error_code(timed_out_inactivity);
              (*(ppVar22->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])
                        (ppVar22,local_88,1,0);
              goto LAB_0024e589;
            }
          }
        }
        psVar8 = (ppVar22->super_peer_connection_hot_members).m_settings;
        local_80._0_1_ = 0;
        local_88 = (undefined1  [8])&psVar8->m_mutex;
        ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_88);
        local_80._0_1_ = true;
        iVar15 = (psVar8->m_store).m_ints._M_elems[0x1b];
        ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_88);
        bVar27 = is_i2p(&ppVar22->m_socket);
        if (((((bVar25 & 4) == 0) ||
             (((ppVar22->super_peer_connection_hot_members).field_0x28 & 2) != 0)) ||
            (iVar16 = (*(ppVar22->super_bandwidth_socket)._vptr_bandwidth_socket[0x1b])(ppVar22),
            (char)iVar16 == '\0')) || (local_70 <= (long)(iVar15 << bVar27 * '\x02') * 1000000000))
        {
          lVar24 = (ppVar22->m_connect).__d.__r;
          lVar19 = (long)(ppVar22->m_last_unchoke).m_time_diff.__r * 1000000 + lVar24;
          lVar20 = (long)(ppVar22->m_last_incoming_request).m_time_diff.__r * 1000000 + lVar24;
          lVar24 = (long)(ppVar22->m_last_sent_payload).m_time_diff.__r * 1000000 + lVar24;
          if (lVar20 < lVar19) {
            lVar20 = lVar19;
          }
          if (lVar20 <= lVar24) {
            lVar20 = lVar24;
          }
          if (((((bVar25 & 4) != 0) &&
               (bVar5 = (ppVar22->super_peer_connection_hot_members).field_0x28, (bVar5 & 2) == 0))
              && (((bVar5 & 0x20) == 0 &&
                  (((ppVar22->m_requests).
                    super_vector<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>
                    .
                    super__Vector_base<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>
                    ._M_impl.super__Vector_impl_data._M_start ==
                    (ppVar22->m_requests).
                    super_vector<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>
                    .
                    super__Vector_base<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>
                    ._M_impl.super__Vector_impl_data._M_finish && (ppVar22->m_reading_bytes == 0))))
                 )) && ((ppVar22->field_0x887 & 2) != 0)) {
            bVar27 = torrent::is_finished(local_90);
            if ((bVar27 || (*(ulong *)&(local_90->super_torrent_hot_members).field_0x48 & 0x81000000
                           ) != 0) && (uVar26 = local_78.__r - lVar20, 60000000000 < (long)uVar26))
            {
              _local_88 = errors::make_error_code(timed_out_no_request);
              p_Var21 = (_List_node_base *)plVar4;
              do {
                p_Var21 = (((_List_base<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
                             *)&p_Var21->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
                if (p_Var21 == (_List_node_base *)plVar4) goto LAB_0024efd3;
                cVar14 = (**(code **)(*(long *)p_Var21[1]._M_next + 0x128))
                                   (p_Var21[1]._M_next,local_88);
              } while (cVar14 != '\0');
              if (p_Var21 == (_List_node_base *)plVar4) {
LAB_0024efd3:
                peer_log(ppVar22,info,"NO_REQUEST","waited %d seconds",uVar26 / 1000000000);
                _local_88 = errors::make_error_code(timed_out_no_request);
                (*(ppVar22->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])
                          (ppVar22,local_88,1,0);
                goto LAB_0024e589;
              }
            }
          }
          iVar15 = (ppVar22->m_became_uninterested).m_time_diff.__r;
          lVar24 = local_78.__r - (ppVar22->m_connect).__d.__r;
          iVar16 = (ppVar22->m_became_uninteresting).m_time_diff.__r;
          psVar8 = (ppVar22->super_peer_connection_hot_members).m_settings;
          local_80._0_1_ = 0;
          local_88 = (undefined1  [8])&psVar8->m_mutex;
          ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_88);
          local_80._0_1_ = true;
          iVar6 = (psVar8->m_store).m_ints._M_elems[0x13];
          ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_88);
          iVar17 = (*(((ppVar22->super_peer_connection_hot_members).m_ses)->super_session_logger).
                     _vptr_session_logger[0x1e])();
          local_70 = CONCAT44(local_70._4_4_,iVar17);
          psVar8 = (ppVar22->super_peer_connection_hot_members).m_settings;
          local_80._0_1_ = 0;
          local_88 = (undefined1  [8])&psVar8->m_mutex;
          ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_88);
          local_80._0_1_ = true;
          iVar17 = (psVar8->m_store).m_ints._M_elems[0x55];
          ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_88);
          ppVar22 = local_60;
          tick_interval_ms_00 = local_64;
          if ((((bVar25 & 4) != 0) &&
              (((local_60->super_peer_connection_hot_members).field_0x28 & 0x10) == 0)) &&
             ((local_60->field_0x887 & 2) == 0)) {
            lVar19 = (long)iVar15 * -1000000 + lVar24;
            lVar20 = (long)iVar6 * 1000000000;
            if (lVar20 < lVar19) {
              lVar24 = lVar24 + (long)iVar16 * -1000000;
              if ((lVar20 < lVar24) &&
                 (iVar17 + -5 <= (int)local_70 ||
                  (int)(((uint)((ulong)*(undefined8 *)
                                        &(local_90->super_torrent_hot_members).field_0x48 >> 0x21) &
                        0xffffff) - 5) <=
                  (int)((ulong)((long)(local_90->super_torrent_hot_members).m_connections.
                                      super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                      .
                                      super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(local_90->super_torrent_hot_members).m_connections.
                                     super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                     .
                                     super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3) -
                  (int)((ulong)((long)(local_90->m_peers_to_disconnect).
                                      super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(local_90->m_peers_to_disconnect).
                                     super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 4))) {
                local_70 = lVar19;
                _local_88 = errors::make_error_code(timed_out_no_interest);
                ppVar22 = local_60;
                tick_interval_ms_00 = local_64;
                p_Var21 = (_List_node_base *)plVar4;
                do {
                  p_Var21 = (((_List_base<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
                               *)&p_Var21->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
                  if (p_Var21 == (_List_node_base *)plVar4) goto LAB_0024ec35;
                  cVar14 = (**(code **)(*(long *)p_Var21[1]._M_next + 0x128))
                                     (p_Var21[1]._M_next,local_88);
                } while (cVar14 != '\0');
                if (p_Var21 == (_List_node_base *)plVar4) {
LAB_0024ec35:
                  iVar15 = (*(((ppVar22->super_peer_connection_hot_members).m_ses)->
                             super_session_logger)._vptr_session_logger[5])();
                  if ((short)*(undefined4 *)(CONCAT44(extraout_var,iVar15) + 0x68) < 0) {
                    auVar11 = SEXT816(lVar24) * SEXT816(0x112e0be826d694b3);
                    peer_log(ppVar22,info,"MUTUAL_NO_INTEREST","t1: %d t2: %d",
                             (ulong)(uint)((int)(SUB168(SEXT816(local_70) *
                                                        SEXT816(0x112e0be826d694b3),8) >> 0x1a) -
                                          (SUB164(SEXT816(local_70) * SEXT816(0x112e0be826d694b3),
                                                  0xc) >> 0x1f)),
                             (ulong)(uint)((int)(auVar11._8_8_ >> 0x1a) - (auVar11._12_4_ >> 0x1f)))
                    ;
                  }
                  _local_88 = errors::make_error_code(timed_out_no_interest);
                  (*(ppVar22->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])
                            (ppVar22,local_88,1,0);
                  goto LAB_0024e589;
                }
              }
            }
          }
          if ((((bVar25 & 4) != 0) &&
              ((ppVar22->m_download_queue).
               super_vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
               .
               super__Vector_base<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               (ppVar22->m_download_queue).
               super_vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
               .
               super__Vector_base<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
               ._M_impl.super__Vector_impl_data._M_finish)) &&
             ((0 < ppVar22->m_quota[1] &&
              (lVar24 = (ppVar22->m_connect).__d.__r,
              iVar15 = (ppVar22->m_requested).m_time_diff.__r, iVar16 = request_timeout(ppVar22),
              tick_interval_ms_00 = local_64,
              lVar24 + (long)iVar16 * 1000000000 + (long)iVar15 * 1000000 < local_78.__r)))) {
            snub_peer(ppVar22);
          }
          keep_alive(ppVar22);
          if (((((ppVar22->field_0x887 & 0x20) != 0) && (-1 < *(short *)&ppVar22->field_0x885)) &&
              (0 < ppVar22->m_downloaded_last_second)) &&
             (*(int *)&(ppVar22->m_statistics).m_stat.
                       super_array<libtorrent::aux::stat_channel,_6UL>.field_0x28 <=
              ppVar22->m_downloaded_last_second + 5000)) {
            ppVar22->field_0x887 = ppVar22->field_0x887 & 0xdf;
            iVar15 = (*(((ppVar22->super_peer_connection_hot_members).m_ses)->super_session_logger).
                       _vptr_session_logger[5])();
            if ((short)*(undefined4 *)(CONCAT44(extraout_var_00,iVar15) + 0x68) < 0) {
              peer_log(ppVar22,info,"SLOW_START","exit slow start: prev-dl: %d dl: %d",
                       (ulong)(uint)ppVar22->m_downloaded_last_second,
                       (ulong)*(uint *)&(ppVar22->m_statistics).m_stat.
                                        super_array<libtorrent::aux::stat_channel,_6UL>.field_0x28);
            }
          }
          iVar7 = *(int32_t *)
                   &(ppVar22->m_statistics).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.
                    field_0x8;
          ppVar22->m_downloaded_last_second =
               *(int32_t *)
                &(ppVar22->m_statistics).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.
                 field_0x28;
          ppVar22->m_uploaded_last_second = iVar7;
          lVar24 = 0x7f8;
          do {
            stat_channel::second_tick
                      ((stat_channel *)
                       ((long)&(ppVar22->super_bandwidth_socket)._vptr_bandwidth_socket + lVar24),
                       tick_interval_ms_00);
            lVar24 = lVar24 + 0x10;
          } while (lVar24 != 0x858);
          iVar15 = *(int *)&(ppVar22->m_statistics).m_stat.
                            super_array<libtorrent::aux::stat_channel,_6UL>.field_0xc;
          if (ppVar22->m_upload_rate_peak < iVar15) {
            ppVar22->m_upload_rate_peak = iVar15;
          }
          iVar15 = *(int *)&(ppVar22->m_statistics).m_stat.
                            super_array<libtorrent::aux::stat_channel,_6UL>.field_0x2c;
          if (ppVar22->m_download_rate_peak < iVar15) {
            ppVar22->m_download_rate_peak = iVar15;
          }
          iVar15 = (*(ppVar22->super_bandwidth_socket)._vptr_bandwidth_socket[1])(ppVar22);
          if (((char)iVar15 == '\0') &&
             (((local_90->super_torrent_hot_members).field_0x4b & 2) != 0)) {
            update_desired_queue_size(ppVar22);
            if ((ppVar22->m_desired_queue_size == ppVar22->m_max_out_request_queue) &&
               (paVar18 = torrent::alerts(local_90),
               ((paVar18->m_alert_mask)._M_i.m_val >> 9 & 1) != 0)) {
              paVar18 = torrent::alerts(local_90);
              torrent::get_handle((torrent *)local_50);
              local_88._0_4_ = 1;
              alert_manager::
              emplace_alert<libtorrent::performance_alert,libtorrent::torrent_handle,libtorrent::performance_alert::performance_warning_t>
                        (paVar18,(torrent_handle *)local_50,(performance_warning_t *)local_88);
              if ((piece_picker *)local_50._8_8_ != (piece_picker *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var2 = (_Atomic_word *)(local_50._8_8_ + 0xc);
                  iVar15 = *p_Var2;
                  *p_Var2 = *p_Var2 + -1;
                  UNLOCK();
                }
                else {
                  iVar15 = *(_Atomic_word *)(local_50._8_8_ + 0xc);
                  *(int *)(local_50._8_8_ + 0xc) = iVar15 + -1;
                }
                if (iVar15 == 1) {
                  (*(code *)(((vector<piece_pos,_piece_index_t> *)local_50._8_8_)->
                            super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                            ).
                            super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                            ._M_impl.super__Vector_impl_data._M_start[3])();
                }
              }
            }
            iVar15 = session_settings::get_int
                               ((ppVar22->super_peer_connection_hot_members).m_settings,0x4004);
            if ((((ppVar22->m_download_queue).
                  super_vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
                  .
                  super__Vector_base<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  (ppVar22->m_download_queue).
                  super_vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
                  .
                  super__Vector_base<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
                  ._M_impl.super__Vector_impl_data._M_finish) && (0 < ppVar22->m_quota[1])) &&
               ((long)iVar15 * 1000000000 <
                (local_78.__r - (ppVar22->m_connect).__d.__r) +
                (long)(ppVar22->m_last_piece).m_time_diff.__r * -1000000)) {
              iVar16 = (*(((ppVar22->super_peer_connection_hot_members).m_ses)->super_session_logger
                         )._vptr_session_logger[5])();
              if ((short)*(undefined4 *)(CONCAT44(extraout_var_01,iVar16) + 0x68) < 0) {
                auVar11 = SEXT816((local_78.__r - (ppVar22->m_connect).__d.__r) +
                                  (long)(ppVar22->m_last_piece).m_time_diff.__r * -1000000) *
                          SEXT816(0x112e0be826d694b3);
                peer_log(ppVar22,info,"PIECE_REQUEST_TIMED_OUT","%d time: %d to: %d",
                         (ulong)(uint)((int)((ulong)((long)(ppVar22->m_download_queue).
                                                                                                                      
                                                  super_vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
                                                  .
                                                  super__Vector_base<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(ppVar22->m_download_queue).
                                                                                                                
                                                  super_vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
                                                  .
                                                  super__Vector_base<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                                      -0x55555555),
                         (ulong)(uint)((int)(auVar11._8_8_ >> 0x1a) - (auVar11._12_4_ >> 0x1f)),
                         iVar15);
              }
              snub_peer(ppVar22);
            }
            fill_send_buffer(ppVar22);
          }
        }
        else {
          peer_log(ppVar22,info,"NO_HANDSHAKE","waited %d seconds",
                   (ulong)(uint)((int)(SUB168(SEXT816(local_70) * SEXT816(0x112e0be826d694b3),8) >>
                                      0x1a) -
                                (SUB164(SEXT816(local_70) * SEXT816(0x112e0be826d694b3),0xc) >> 0x1f
                                )));
          _local_88 = errors::make_error_code(timed_out_no_handshake);
          (*(ppVar22->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(ppVar22,local_88,1,0);
        }
      }
    }
  }
LAB_0024e589:
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  if (local_38 != (element_type *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
  }
  return;
}

Assistant:

void peer_connection::second_tick(int const tick_interval_ms)
	{
		TORRENT_ASSERT(is_single_thread());
		time_point const now = aux::time_now();
		std::shared_ptr<peer_connection> me(self());

		// the invariant check must be run before me is destructed
		// in case the peer got disconnected
		INVARIANT_CHECK;

		auto t = m_torrent.lock();

		std::uint8_t warning = 0;
		// drain the IP overhead from the bandwidth limiters
		if (m_settings.get_bool(settings_pack::rate_limit_ip_overhead) && t)
		{
			warning |= m_ses.use_quota_overhead(*this
				, m_statistics.download_ip_overhead()
				, m_statistics.upload_ip_overhead());
			warning |= m_ses.use_quota_overhead(*t
				, m_statistics.download_ip_overhead()
				, m_statistics.upload_ip_overhead());
		}

		if (warning && t->alerts().should_post<performance_alert>())
		{
			for (int channel = 0; channel < 2; ++channel)
			{
				if (((warning >> channel) & 1u) == 0) continue;
				t->alerts().emplace_alert<performance_alert>(t->get_handle()
					, channel == peer_connection::download_channel
					? performance_alert::download_limit_too_low
					: performance_alert::upload_limit_too_low);
			}
		}

		if (!t || m_disconnecting)
		{
			TORRENT_ASSERT(t || !m_connecting);
			if (m_connecting)
			{
				m_counters.inc_stats_counter(counters::num_peers_half_open, -1);
				if (t) t->dec_num_connecting(m_peer_info);
				m_connecting = false;
			}
			disconnect(errors::torrent_aborted, operation_t::bittorrent);
			return;
		}

		if (m_endgame_mode
			&& m_interesting
			&& m_download_queue.empty()
			&& m_request_queue.empty()
			&& now - seconds(5) >= m_last_request.get(m_connect))
		{
			// this happens when we're in strict end-game
			// mode and the peer could not request any blocks
			// because they were all taken but there were still
			// unrequested blocks. Now, 5 seconds later, there
			// might not be any unrequested blocks anymore, so
			// we should try to pick another block to see
			// if we can pick a busy one
			m_last_request.set(m_connect, now);
			if (request_a_block(*t, *this))
				m_counters.inc_stats_counter(counters::end_game_piece_picks);
			if (m_disconnecting) return;
			send_block_requests();
		}

#ifndef TORRENT_DISABLE_SUPERSEEDING
		if (t->super_seeding()
			&& t->ready_for_connections()
			&& !m_peer_interested
			&& m_became_uninterested.get(m_connect) + seconds(10) < now)
		{
			// maybe we need to try another piece, to see if the peer
			// become interested in us then
			superseed_piece(piece_index_t(-1), t->get_piece_to_super_seed(m_have_piece));
		}
#endif

		on_tick();
		if (is_disconnecting()) return;

#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto const& e : m_extensions)
		{
			e->tick();
		}
		if (is_disconnecting()) return;
#endif

		// if the peer hasn't said a thing for a certain
		// time, it is considered to have timed out
		time_duration d = now - m_last_receive.get(m_connect);

		if (m_connecting)
		{
			int connect_timeout = m_settings.get_int(settings_pack::peer_connect_timeout);
			if (m_peer_info) connect_timeout += 3 * m_peer_info->failcount;

			// SSL and i2p handshakes are slow
			if (is_ssl(m_socket))
				connect_timeout += 10;

#if TORRENT_USE_I2P
			if (is_i2p(m_socket))
				connect_timeout += 20;
#endif

			if (d > seconds(connect_timeout)
				&& can_disconnect(errors::timed_out))
			{
#ifndef TORRENT_DISABLE_LOGGING
				peer_log(peer_log_alert::info, "CONNECT_FAILED", "waited %d seconds"
					, int(total_seconds(d)));
#endif
				connect_failed(errors::timed_out);
				return;
			}
		}

		// if the bw_network flag isn't set, it means we are not even trying to
		// read from this peer's socket. Most likely because we're applying a
		// rate limit. If the peer is "slow" because we are rate limiting it,
		// don't enforce timeouts. However, as soon as we *do* read from the
		// socket, we expect to receive data, and not have timed out. Then we
		// can enforce the timeouts.
		bool const reading_socket = bool(m_channel_state[download_channel] & peer_info::bw_network);

		// TODO: 2 use a deadline_timer for timeouts. Don't rely on second_tick()!
		// Hook this up to connect timeout as well. This would improve performance
		// because of less work in second_tick(), and might let use remove ticking
		// entirely eventually
		if (reading_socket && d > seconds(timeout()) && !m_connecting && m_reading_bytes == 0
			&& can_disconnect(errors::timed_out_inactivity))
		{
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::info, "LAST_ACTIVITY", "%d seconds ago"
				, int(total_seconds(d)));
#endif
			disconnect(errors::timed_out_inactivity, operation_t::bittorrent);
			return;
		}

		// do not stall waiting for a handshake
		int timeout = m_settings.get_int (settings_pack::handshake_timeout);
#if TORRENT_USE_I2P
		timeout *= is_i2p(m_socket) ? 4 : 1;
#endif
		if (reading_socket
			&& !m_connecting
			&& in_handshake()
			&& d > seconds(timeout))
		{
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::info, "NO_HANDSHAKE", "waited %d seconds"
				, int(total_seconds(d)));
#endif
			disconnect(errors::timed_out_no_handshake, operation_t::bittorrent);
			return;
		}

		// disconnect peers that we unchoked, but they didn't send a request in
		// the last 60 seconds, and we haven't been working on servicing a request
		// for more than 60 seconds.
		// but only if we're a seed
		d = now - std::max(std::max(m_last_unchoke.get(m_connect)
			, m_last_incoming_request.get(m_connect))
			, m_last_sent_payload.get(m_connect));

		if (reading_socket
			&& !m_connecting
			&& m_requests.empty()
			&& m_reading_bytes == 0
			&& !m_choked
			&& m_peer_interested
			&& t && t->is_upload_only()
			&& d > seconds(60)
			&& can_disconnect(errors::timed_out_no_request))
		{
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::info, "NO_REQUEST", "waited %d seconds"
				, int(total_seconds(d)));
#endif
			disconnect(errors::timed_out_no_request, operation_t::bittorrent);
			return;
		}

		// if the peer hasn't become interested and we haven't
		// become interested in the peer for 10 minutes, it
		// has also timed out.
		time_duration const d1 = now - m_became_uninterested.get(m_connect);
		time_duration const d2 = now - m_became_uninteresting.get(m_connect);
		time_duration const time_limit = seconds(
			m_settings.get_int(settings_pack::inactivity_timeout));

		// if we are close enough to the limit, consider the peer connection
		// list full. This will enable the inactive timeout
		bool const max_session_conns = m_ses.num_connections()
			>= m_settings.get_int(settings_pack::connections_limit) - 5;
		bool const max_torrent_conns = t && t->num_peers()
			>= t->max_connections() - 5;

		// don't bother disconnect peers we haven't been interested
		// in (and that hasn't been interested in us) for a while
		// unless we have used up all our connection slots
		if (reading_socket
			&& !m_interesting
			&& !m_peer_interested
			&& d1 > time_limit
			&& d2 > time_limit
			&& (max_session_conns || max_torrent_conns)
			&& can_disconnect(errors::timed_out_no_interest))
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log(peer_log_alert::info))
			{
				peer_log(peer_log_alert::info, "MUTUAL_NO_INTEREST", "t1: %d t2: %d"
					, int(total_seconds(d1)), int(total_seconds(d2)));
			}
#endif
			disconnect(errors::timed_out_no_interest, operation_t::bittorrent);
			return;
		}

		if (reading_socket
			&& !m_download_queue.empty()
			&& m_quota[download_channel] > 0
			&& now > m_requested.get(m_connect) + seconds(request_timeout()))
		{
			snub_peer();
		}

		// if we haven't sent something in too long, send a keep-alive
		keep_alive();

		// if our download rate isn't increasing significantly anymore, end slow
		// start. The 10kB is to have some slack here.
		// we can't do this when we're choked, because we aren't sending any
		// requests yet, so there hasn't been an opportunity to ramp up the
		// connection yet.
		if (m_slow_start
			&& !m_peer_choked
			&& m_downloaded_last_second > 0
			&& m_downloaded_last_second + 5000
				>= m_statistics.last_payload_downloaded())
		{
			m_slow_start = false;
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log(peer_log_alert::info))
			{
				peer_log(peer_log_alert::info, "SLOW_START", "exit slow start: "
					"prev-dl: %d dl: %d"
					, int(m_downloaded_last_second)
					, m_statistics.last_payload_downloaded());
			}
#endif
		}
		m_downloaded_last_second = m_statistics.last_payload_downloaded();
		m_uploaded_last_second = m_statistics.last_payload_uploaded();

		m_statistics.second_tick(tick_interval_ms);

		if (m_statistics.upload_payload_rate() > m_upload_rate_peak)
		{
			m_upload_rate_peak = m_statistics.upload_payload_rate();
		}
		if (m_statistics.download_payload_rate() > m_download_rate_peak)
		{
			m_download_rate_peak = m_statistics.download_payload_rate();
		}
		if (is_disconnecting()) return;

		if (!t->ready_for_connections()) return;

		update_desired_queue_size();

		if (m_desired_queue_size == m_max_out_request_queue
			&& t->alerts().should_post<performance_alert>())
		{
			t->alerts().emplace_alert<performance_alert>(t->get_handle()
				, performance_alert::outstanding_request_limit_reached);
		}

		int const piece_timeout = m_settings.get_int(settings_pack::piece_timeout);

		if (!m_download_queue.empty()
			&& m_quota[download_channel] > 0
			&& now - m_last_piece.get(m_connect) > seconds(piece_timeout))
		{
			// this peer isn't sending the pieces we've
			// requested (this has been observed by BitComet)
			// in this case we'll clear our download queue and
			// re-request the blocks.
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log(peer_log_alert::info))
			{
				peer_log(peer_log_alert::info, "PIECE_REQUEST_TIMED_OUT"
					, "%d time: %d to: %d"
					, int(m_download_queue.size()), int(total_seconds(now - m_last_piece.get(m_connect)))
					, piece_timeout);
			}
#endif

			snub_peer();
		}

		fill_send_buffer();
	}